

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O0

void write_slot(MultiPCM *ptChip,slot_t *slot,INT32 reg,UINT8 data)

{
  byte bVar1;
  byte bVar2;
  uint local_24;
  UINT32 pitch;
  UINT8 oct;
  UINT8 data_local;
  INT32 reg_local;
  slot_t *slot_local;
  MultiPCM *ptChip_local;
  
  slot->regs[reg] = data;
  switch(reg) {
  case 0:
    slot->pan = (int)(uint)data >> 4;
    break;
  case 1:
    init_sample(ptChip,&slot->sample,(ushort)slot->regs[1] | (slot->regs[2] & 1) << 8);
    write_slot(ptChip,slot,6,(slot->sample).lfo_vibrato_reg);
    write_slot(ptChip,slot,7,(slot->sample).lfo_amplitude_reg);
    break;
  case 2:
  case 3:
    bVar1 = (char)((int)(uint)slot->regs[3] >> 4) - 1;
    bVar2 = bVar1 & 0xf;
    if ((bVar1 & 8) == 0) {
      local_24 = ptChip->freq_step_table[(slot->regs[3] & 0xf) << 6 | (int)(uint)slot->regs[2] >> 2]
                 << bVar2;
    }
    else {
      local_24 = ptChip->freq_step_table[(slot->regs[3] & 0xf) << 6 | (int)(uint)slot->regs[2] >> 2]
                 >> (0x10 - bVar2 & 0x1f);
    }
    slot->step = (UINT32)(long)((float)local_24 / ptChip->rate);
    break;
  case 4:
    if ((data & 0x80) == 0) {
      if (slot->playing != '\0') {
        if ((slot->sample).release_reg == '\x0f') {
          slot->playing = '\0';
        }
        else {
          (slot->envelope_gen).state = RELEASE;
        }
      }
    }
    else {
      slot->playing = '\x01';
      slot->base = (slot->sample).start;
      slot->offset = 0;
      slot->prev_sample = 0;
      slot->total_level = slot->dest_total_level << 0xc;
      envelope_generator_calc(ptChip,slot);
      (slot->envelope_gen).state = ATTACK;
      (slot->envelope_gen).volume = 0;
      if ((ptChip->sega_banking != '\0') &&
         (slot->base = slot->base & 0x1fffff, (slot->base & 0x100000) != 0)) {
        if ((slot->base & 0x80000) == 0) {
          slot->base = slot->base & 0x7ffff | ptChip->bank0;
        }
        else {
          slot->base = slot->base & 0x7ffff | ptChip->bank1;
        }
      }
    }
    break;
  case 5:
    slot->dest_total_level = (int)(uint)data >> 1;
    if ((data & 1) == 0) {
      if (slot->dest_total_level < slot->total_level >> 0xc) {
        slot->total_level_step = ptChip->total_level_steps[0];
      }
      else {
        slot->total_level_step = ptChip->total_level_steps[1];
      }
    }
    else {
      slot->total_level = slot->dest_total_level << 0xc;
    }
    break;
  case 6:
    if (data != '\0') {
      lfo_compute_step(ptChip,&slot->pitch_lfo,(byte)((int)(uint)slot->regs[6] >> 3) & 7,
                       slot->regs[6] & 7,'\0');
      lfo_compute_step(ptChip,&slot->amplitude_lfo,(byte)((int)(uint)slot->regs[6] >> 3) & 7,
                       slot->regs[7] & 7,'\x01');
    }
    break;
  case 7:
    if (data != '\0') {
      lfo_compute_step(ptChip,&slot->pitch_lfo,(byte)((int)(uint)slot->regs[6] >> 3) & 7,
                       slot->regs[6] & 7,'\0');
      lfo_compute_step(ptChip,&slot->amplitude_lfo,(byte)((int)(uint)slot->regs[6] >> 3) & 7,
                       slot->regs[7] & 7,'\x01');
    }
  }
  return;
}

Assistant:

static void write_slot(MultiPCM *ptChip, slot_t *slot, INT32 reg, UINT8 data)
{
	slot->regs[reg] = data;

	switch(reg)
	{
		case 0: // PANPOT
			slot->pan = (data >> 4) & 0xf;
			break;
		case 1: // Sample
			//according to YMF278 sample write causes some base params written to the regs (envelope+lfos)
			//the game should never change the sample while playing.
			// patched to load all sample data here, so registers 6 and 7 aren't overridden by KeyOn -Valley Bell
			init_sample(ptChip, &slot->sample, slot->regs[1] | ((slot->regs[2] & 1) << 8));
			write_slot(ptChip, slot, 6, slot->sample.lfo_vibrato_reg);
			write_slot(ptChip, slot, 7, slot->sample.lfo_amplitude_reg);
			break;
		case 2: //Pitch
		case 3:
			{
				UINT8 oct = ((slot->regs[3] >> 4) - 1) & 0xf;
				UINT32 pitch = ((slot->regs[3] & 0xf) << 6) | (slot->regs[2] >> 2);
				pitch = ptChip->freq_step_table[pitch];
				if (oct & 0x8)
					pitch >>= (16 - oct);
				else
					pitch <<= oct;
				slot->step = pitch / ptChip->rate;
			}
			break;
		case 4:     //KeyOn/Off (and more?)
			if (data & 0x80)       //KeyOn
			{
				slot->playing = 1;
				slot->base = slot->sample.start;
				slot->offset = 0;
				slot->prev_sample = 0;
				slot->total_level = slot->dest_total_level << TL_SHIFT;

				envelope_generator_calc(ptChip, slot);
				slot->envelope_gen.state = ATTACK;
				slot->envelope_gen.volume = 0;

				if (ptChip->sega_banking)
				{
					slot->base &= 0x1fffff;
					if (slot->base & 0x100000)
					{
						if (slot->base & 0x080000)
							slot->base = (slot->base & 0x07ffff) | ptChip->bank1;
						else
							slot->base = (slot->base & 0x07ffff) | ptChip->bank0;
					}
				}

			}
			else
			{
				if (slot->playing)
				{
					if (slot->sample.release_reg != 0xf)
						slot->envelope_gen.state = RELEASE;
					else
						slot->playing = 0;
				}
			}
			break;
		case 5: // TL + Interpolation
			slot->dest_total_level = (data >> 1) & 0x7f;
			if (!(data & 1))   //Interpolate TL
			{
				if ((slot->total_level >> TL_SHIFT) > slot->dest_total_level)
					slot->total_level_step = ptChip->total_level_steps[0]; // decrease
				else
					slot->total_level_step = ptChip->total_level_steps[1]; // increase
			}
			else
			{
				slot->total_level = slot->dest_total_level << TL_SHIFT;
			}
			break;
		case 6: // LFO frequency + Pitch LFO
			if (data)
			{
				lfo_compute_step(ptChip, &slot->pitch_lfo, (slot->regs[6] >> 3) & 7, slot->regs[6] & 7, 0);
				lfo_compute_step(ptChip, &slot->amplitude_lfo, (slot->regs[6] >> 3) & 7, slot->regs[7] & 7, 1);
			}
			break;
		case 7: // Amplitude LFO
			if (data)
			{
				lfo_compute_step(ptChip, &slot->pitch_lfo, (slot->regs[6] >> 3) & 7, slot->regs[6] & 7, 0);
				lfo_compute_step(ptChip, &slot->amplitude_lfo, (slot->regs[6] >> 3) & 7, slot->regs[7] & 7, 1);
			}
			break;
	}
}